

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  long lVar1;
  int iVar2;
  sqlite3_context *pCtx;
  int in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  char *zTab;
  char *zDb;
  int rc;
  char *zReport;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  sqlite3_context *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  char *zDb_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 1) || (in_ESI == 2)) {
    uVar3 = 0xaaaaaaaa;
    pCtx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x295fbb);
    if (in_ESI == 1) {
      zDb_00 = "main";
    }
    else {
      zDb_00 = (char *)pCtx;
      pCtx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x295ffc);
    }
    sqlite3_context_db_handle(in_RDI);
    iVar2 = rtreeCheckTable((sqlite3 *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),zDb_00,(char *)pCtx
                            ,in_stack_ffffffffffffffb8);
    if (iVar2 == 0) {
      sqlite3_result_text(pCtx,(char *)in_RDI,0,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      sqlite3_result_error_code(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    sqlite3_free((void *)0x29608e);
  }
  else {
    sqlite3_result_error
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx,
  int nArg,
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx,
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}